

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_get_params(int which)

{
  int which_local;
  undefined4 local_4;
  
  if (which == 0) {
    local_4 = bn_limit_bits;
  }
  else if (which == 1) {
    local_4 = bn_limit_bits_high;
  }
  else if (which == 2) {
    local_4 = bn_limit_bits_low;
  }
  else if (which == 3) {
    local_4 = bn_limit_bits_mont;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BN_get_params(int which)
{
    if (which == 0)
        return bn_limit_bits;
    else if (which == 1)
        return bn_limit_bits_high;
    else if (which == 2)
        return bn_limit_bits_low;
    else if (which == 3)
        return bn_limit_bits_mont;
    else
        return 0;
}